

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollarea.cpp
# Opt level: O1

QSize __thiscall QScrollArea::viewportSizeHint(QScrollArea *this)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  QFontMetrics local_20 [8];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  if (((*(long *)(lVar1 + 0x2f8) == 0) || (*(int *)(*(long *)(lVar1 + 0x2f8) + 4) == 0)) ||
     (*(long *)(lVar1 + 0x300) == 0)) {
    QFontMetrics::QFontMetrics
              (local_20,&((this->super_QAbstractScrollArea).super_QFrame.super_QWidget.data)->fnt);
    iVar2 = QFontMetrics::height();
    QFontMetrics::~QFontMetrics(local_20);
    uVar3 = (ulong)(uint)(iVar2 * 6);
    uVar4 = (ulong)(uint)(iVar2 << 2);
  }
  else {
    if (*(char *)(lVar1 + 0x310) == '\x01') {
      uVar3 = (**(code **)(**(long **)(lVar1 + 0x300) + 0x70))();
    }
    else {
      lVar1 = (*(long **)(lVar1 + 0x300))[4];
      uVar3 = CONCAT44((*(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x18)) + 1,
                       (*(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14)) + 1);
    }
    uVar4 = uVar3 >> 0x20;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QSize)(uVar3 & 0xffffffff | uVar4 << 0x20);
  }
  __stack_chk_fail();
}

Assistant:

QSize QScrollArea::viewportSizeHint() const
{
    Q_D(const QScrollArea);
    if (d->widget) {
        return d->resizable ? d->widget->sizeHint() : d->widget->size();
    }
    const int h = fontMetrics().height();
    return QSize(6 * h, 4 * h);
}